

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

int32_t __thiscall helics::InputInfo::getProperty(InputInfo *this,int32_t option)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  rep rVar4;
  int in_ESI;
  vector<int,_std::allocator<int>_> *in_RDI;
  bool flagval;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  duration<long,_std::ratio<1L,_1000L>_> in_stack_ffffffffffffffe0;
  bool local_15;
  
  local_15 = false;
  if (in_ESI == 0x18d) {
    local_15 = (bool)(*(byte *)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish & 1);
  }
  else if (in_ESI == 0x192) {
    local_15 = (bool)((*(byte *)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish ^ 0xff) & 1);
  }
  else if (in_ESI == 0x197) {
    local_15 = *(int *)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage == 1;
  }
  else if (in_ESI == 0x199) {
    local_15 = *(int *)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage != 1;
  }
  else if (in_ESI == 0x19e) {
    local_15 = (bool)(*(byte *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish + 5) & 1);
  }
  else if (in_ESI == 0x1c6) {
    local_15 = (bool)(*(byte *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish + 3) & 1);
  }
  else if (in_ESI == 0x1db) {
    local_15 = (bool)(*(byte *)((long)&in_RDI[4].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish + 4) & 1);
  }
  else {
    if (in_ESI == 0x1fe) {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe0.__r);
      if (!bVar1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::back(in_RDI);
        return *pvVar3;
      }
      return -1;
    }
    if (in_ESI == 0x200) {
      local_15 = std::vector<int,_std::allocator<int>_>::empty
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffe0.__r);
    }
    else {
      if (in_ESI == 0x20a) {
        sVar2 = std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::size
                          ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                           &in_RDI[7].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish);
        return (int32_t)sVar2;
      }
      if (in_ESI == 0x22d) {
        TimeRepresentation<count_time<9,_long>_>::to_ms
                  ((TimeRepresentation<count_time<9,_long>_> *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count
                          ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xffffffffffffffe0);
        return (int32_t)rVar4;
      }
    }
  }
  return (uint)(local_15 != false);
}

Assistant:

int32_t InputInfo::getProperty(int32_t option) const
{
    bool flagval = false;
    switch (option) {
        case defs::Options::IGNORE_INTERRUPTS:
            flagval = not_interruptible;
            break;
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            flagval = only_update_on_change;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            flagval = required;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            flagval = !required;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            flagval = (required_connnections == 1);
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            flagval = (required_connnections != 1);
            break;
        case defs::Options::STRICT_TYPE_CHECKING:
            flagval = strict_type_matching;
            break;
        case defs::Options::CONNECTIONS:
            return static_cast<int32_t>(input_sources.size());
        case defs::Options::INPUT_PRIORITY_LOCATION:
            return priority_sources.empty() ? -1 : priority_sources.back();
        case defs::Options::CLEAR_PRIORITY_LIST:
            flagval = priority_sources.empty();
            break;
        case defs::Options::TIME_RESTRICTED:
            return static_cast<std::int32_t>(minTimeGap.to_ms().count());
        default:
            break;
    }
    return flagval ? 1 : 0;
}